

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O1

void __thiscall
particleSamples::perform_weak_resonance_feed_down_Sigma_to_Lambda(particleSamples *this)

{
  int iVar1;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar2;
  vector<particle_info,std::allocator<particle_info>> *this_00;
  undefined4 uVar3;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *pvVar4;
  int iVar5;
  long lVar6;
  particle_info *ppVar7;
  ulong uVar8;
  iterator __position;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  byte bVar12;
  particle_info daughter2;
  particle_info daughter1;
  particle_info local_120;
  particle_info local_a8;
  
  bVar12 = 0;
  iVar1 = this->particle_monval;
  iVar5 = -iVar1;
  if (0 < iVar1) {
    iVar5 = iVar1;
  }
  if ((iVar5 == 0xc32) &&
     ((this->resonance_list_Sigma0->
      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (this->resonance_list_Sigma0->
      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      )._M_impl.super__Vector_impl_data._M_start)) {
    uVar9 = 0;
    do {
      pvVar4 = this->resonance_list_Sigma0;
      pvVar2 = (pvVar4->
               super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar9];
      if (*(pointer *)
           ((long)&(pvVar2->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                   _M_impl.super__Vector_impl_data + 8) !=
          (pvVar2->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        uVar8 = 0;
        uVar10 = 1;
        do {
          local_a8.mass = 1.116;
          local_120.mass = 0.0;
          particle_decay::perform_two_body_decay
                    (this->decayer_ptr,
                     (particle_info *)
                     (uVar8 * 0x78 +
                     *(long *)&((pvVar4->
                                super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar9]->
                               super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                               _M_impl.super__Vector_impl_data),&local_a8,&local_120);
          this_00 = (vector<particle_info,std::allocator<particle_info>> *)
                    (this->particle_list->
                    super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar9];
          __position._M_current = *(anon_struct_120_15_f999644b **)(this_00 + 8);
          if (__position._M_current == *(anon_struct_120_15_f999644b **)(this_00 + 0x10)) {
            std::vector<particle_info,std::allocator<particle_info>>::
            _M_realloc_insert<particle_info_const&>(this_00,__position,&local_a8);
          }
          else {
            ppVar7 = &local_a8;
            for (lVar6 = 0xf; lVar6 != 0; lVar6 = lVar6 + -1) {
              uVar3 = *(undefined4 *)&ppVar7->field_0x4;
              (__position._M_current)->monval = ppVar7->monval;
              *(undefined4 *)&(__position._M_current)->field_0x4 = uVar3;
              ppVar7 = (particle_info *)((long)ppVar7 + (ulong)bVar12 * -0x10 + 8);
              __position._M_current = __position._M_current + (ulong)bVar12 * -0x10 + 8;
            }
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x78;
          }
          pvVar4 = this->resonance_list_Sigma0;
          pvVar2 = (pvVar4->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar9];
          uVar8 = ((long)*(pointer *)
                          ((long)&(pvVar2->
                                  super__Vector_base<particle_info,_std::allocator<particle_info>_>)
                                  ._M_impl.super__Vector_impl_data + 8) -
                   *(long *)&(pvVar2->
                             super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                             _M_impl.super__Vector_impl_data >> 3) * -0x1111111111111111;
          bVar11 = uVar10 <= uVar8;
          lVar6 = uVar8 - uVar10;
          uVar8 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar11 && lVar6 != 0);
      }
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (uVar9 < (ulong)((long)(this->resonance_list_Sigma0->
                                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->resonance_list_Sigma0->
                                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void particleSamples::perform_weak_resonance_feed_down_Sigma_to_Lambda() {
    if (std::abs(particle_monval) == 3122) {
        // consider Sigma^0 feed down to Lambda
        for (unsigned int iev = 0; iev < resonance_list_Sigma0->size(); iev++) {
            for (unsigned int i = 0; i < (*resonance_list_Sigma0)[iev]->size();
                 i++) {
                particle_info daughter1;
                particle_info daughter2;
                daughter1.mass = 1.116;  // mass of Lambda
                daughter2.mass = 0.0;    // mass of photon
                decayer_ptr->perform_two_body_decay(
                    (*(*resonance_list_Sigma0)[iev])[i], daughter1, daughter2);
                (*particle_list)[iev]->push_back(daughter1);
            }
        }
    }
}